

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

void tcg_out_qemu_st(TCGContext_conflict9 *s,TCGArg *args,_Bool is64)

{
  TCGReg arg;
  TCGReg addrlo;
  TCGReg oi;
  uint uVar1;
  undefined4 uVar2;
  undefined7 in_register_00000011;
  uint opc;
  uint mem_index;
  TCGReg TVar3;
  int in_stack_ffffffffffffff98;
  tcg_insn_unit *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  tcg_insn_unit *label_ptr [2];
  
  uVar2 = (undefined4)CONCAT71(in_register_00000011,is64);
  arg = (TCGReg)*args;
  addrlo = *(TCGReg *)(args + 1);
  oi = *(TCGReg *)(args + 2);
  mem_index = oi >> 4;
  tcg_out_tlb_load(s,addrlo,oi & TCG_REG_R15,mem_index,(MemOp)label_ptr,(tcg_insn_unit **)0x4,
                   in_stack_ffffffffffffff98);
  uVar1 = 0;
  if (have_movbe == false) {
    uVar1 = mem_index & 8;
  }
  opc = 0x2f1;
  if (have_movbe == false) {
    opc = 0x89;
  }
  if ((mem_index & 8) == 0) {
    opc = 0x89;
  }
  TVar3 = arg;
  switch(mem_index & 3) {
  case 0:
    opc = 0x2088;
    break;
  case 1:
    if (uVar1 != 0) {
      TVar3 = TCG_REG_EDI;
      tcg_out_mov(s,TCG_TYPE_I32,TCG_REG_EDI,arg);
      tcg_out_rolw_8(s,7);
    }
    opc = opc | 0x400;
    break;
  case 2:
    if (uVar1 != 0) {
      TVar3 = TCG_REG_EDI;
      tcg_out_mov(s,TCG_TYPE_I32,TCG_REG_EDI,arg);
      tcg_out_bswap32(s,7);
    }
    break;
  case 3:
    if (uVar1 != 0) {
      TVar3 = TCG_REG_EDI;
      tcg_out_mov(s,TCG_TYPE_I64,TCG_REG_EDI,arg);
      tcg_out_bswap64(s,7);
    }
    opc = opc | 0x1000;
  }
  tcg_out_modrm_sib_offset(s,opc,TVar3,6,-1,0,0);
  add_qemu_ldst_label(s,false,SUB41(uVar2,0),oi,arg,addrlo,(TCGReg)s->code_ptr,(TCGReg)label_ptr,
                      in_stack_ffffffffffffffa8,
                      (tcg_insn_unit **)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

static void tcg_out_qemu_st(TCGContext *s, const TCGArg *args, bool is64)
{
    TCGReg datalo, datahi, addrlo;
    TCGReg addrhi QEMU_UNUSED_VAR;
    TCGMemOpIdx oi;
    MemOp opc;
    int mem_index;
    tcg_insn_unit *label_ptr[2];

    datalo = *args++;
    datahi = (TCG_TARGET_REG_BITS == 32 && is64 ? *args++ : 0);
    addrlo = *args++;
    addrhi = (TARGET_LONG_BITS > TCG_TARGET_REG_BITS ? *args++ : 0);
    oi = *args++;
    opc = get_memop(oi);

    mem_index = get_mmuidx(oi);

    tcg_out_tlb_load(s, addrlo, addrhi, mem_index, opc,
                     label_ptr, offsetof(CPUTLBEntry, addr_write));

    /* TLB Hit.  */
    tcg_out_qemu_st_direct(s, datalo, datahi, TCG_REG_L1, -1, 0, 0, opc);

    /* Record the current context of a store into ldst label */
    add_qemu_ldst_label(s, false, is64, oi, datalo, datahi, addrlo, addrhi,
                        s->code_ptr, label_ptr);
}